

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t ismode_w(wchar_t *start,wchar_t *end,wchar_t *permset)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *local_30;
  wchar_t *p;
  wchar_t *permset_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  if (start < end) {
    *permset = L'\0';
    local_30 = start;
    while (local_30 < end) {
      pwVar2 = local_30 + 1;
      wVar1 = *local_30;
      local_30 = pwVar2;
      if (wVar1 != L'-') {
        if (wVar1 == L'R') {
LAB_006d630d:
          *permset = *permset | 4;
        }
        else if (wVar1 == L'W') {
LAB_006d631a:
          *permset = *permset | 2;
        }
        else {
          if (wVar1 != L'X') {
            if (wVar1 == L'r') goto LAB_006d630d;
            if (wVar1 == L'w') goto LAB_006d631a;
            if (wVar1 != L'x') {
              return L'\0';
            }
          }
          *permset = *permset | 1;
        }
      }
    }
    start_local._4_4_ = L'\x01';
  }
  else {
    start_local._4_4_ = L'\0';
  }
  return start_local._4_4_;
}

Assistant:

static int
ismode_w(const wchar_t *start, const wchar_t *end, int *permset)
{
	const wchar_t *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case L'r': case L'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case L'w': case L'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case L'x': case L'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case L'-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}